

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_3> *in_RCX;
  Vector<float,_2> local_70;
  Vector<float,_3> local_68;
  Vector<float,_3> local_58;
  Matrix<float,_2,_3> local_48;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_70.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_70,(Vector<float,_2> *)s_constInVec2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_68.m_data[2] = (evalCtx->coords).m_data[2];
    local_68.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_3>::Vector(&local_68,(Vector<float,_3> *)(s_constInVec3 + 0xc));
  }
  outerProduct<float,3,2>
            (&local_48,(MatrixCaseUtils *)&local_70,(Vector<float,_2> *)&local_68,in_RCX);
  local_58.m_data[2] = local_48.m_data.m_data[2].m_data[0] + local_48.m_data.m_data[2].m_data[1];
  local_58.m_data[0] = local_48.m_data.m_data[0].m_data[0] + local_48.m_data.m_data[0].m_data[1];
  local_58.m_data[1] = local_48.m_data.m_data[1].m_data[1] + local_48.m_data.m_data[1].m_data[0];
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_58);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}